

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

void insert_arg_range(rtosc_arg_val_t *arg,int32_t num,rtosc_arg_val_t *lhsarg,int has_delta,
                     rtosc_arg_val_t *delta,int lhs_overlap,int delta_less_is_endless)

{
  double dVar1;
  undefined7 uVar2;
  uint uVar3;
  size_t sVar4;
  rtosc_arg_val_t *prVar5;
  int32_t num_00;
  rtosc_arg_val_t *prVar6;
  
  prVar6 = arg;
  if (has_delta != 0) {
    prVar6 = arg + 1;
    arg[1].val.b.data = (delta->val).b.data;
    uVar2 = *(undefined7 *)&delta->field_0x1;
    dVar1 = (delta->val).d;
    arg[1].type = delta->type;
    *(undefined7 *)&arg[1].field_0x1 = uVar2;
    arg[1].val.d = dVar1;
  }
  if (lhs_overlap == 0) {
    sVar4 = incsize(lhsarg);
    memcpy(prVar6 + 1,lhsarg,sVar4 * 0x18);
  }
  else {
    if (lhsarg->type == 'a') {
      uVar3 = rtosc_av_arr_len(lhsarg);
      prVar5 = prVar6 + uVar3;
      for (; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
        prVar5[1].val.b.data = (prVar5->val).b.data;
        uVar2 = *(undefined7 *)&prVar5->field_0x1;
        dVar1 = (prVar5->val).d;
        prVar5[1].type = prVar5->type;
        *(undefined7 *)&prVar5[1].field_0x1 = uVar2;
        prVar5[1].val.d = dVar1;
        prVar5 = prVar5 + -1;
      }
    }
    prVar6[1].val.b.data = (lhsarg->val).b.data;
    uVar2 = *(undefined7 *)&lhsarg->field_0x1;
    dVar1 = (lhsarg->val).d;
    prVar6[1].type = lhsarg->type;
    *(undefined7 *)&prVar6[1].field_0x1 = uVar2;
    prVar6[1].val.d = dVar1;
  }
  num_00 = 0;
  if (delta_less_is_endless == 0) {
    num_00 = num;
  }
  arg->type = '-';
  if (has_delta != 0) {
    num_00 = num;
  }
  rtosc_av_rep_num_set(arg,num_00);
  rtosc_av_rep_has_delta_set(arg,has_delta);
  return;
}

Assistant:

static void insert_arg_range(rtosc_arg_val_t* arg, int32_t num,
                             const rtosc_arg_val_t* lhsarg,
                             int has_delta, const rtosc_arg_val_t* delta,
                             int lhs_overlap,
                             int delta_less_is_endless)
{
    rtosc_arg_val_t* first_arg = arg;
    if(has_delta)
        *++arg = *delta;
    if(lhs_overlap)
    {
        if(lhsarg->type == 'a')
        {
            // we inserted an 'a' element, so we need to
            // shift more than one element
            // the shifting amount is always one since array ranges
            // are delta-less
            // we have: '-'  a  a a a
            // =>       '-' 'a' a a a a
            for(int32_t i = rtosc_av_arr_len(lhsarg); i > 0; --i)
                arg[i+1] = arg[i];
        }
        *++arg = *lhsarg;
    }
    else
    {
        memcpy(++arg, lhsarg, incsize(lhsarg) * sizeof(rtosc_arg_val_t));
    }
    first_arg->type = '-';
    rtosc_av_rep_num_set(first_arg, (!has_delta && delta_less_is_endless) ? 0 : num);
    rtosc_av_rep_has_delta_set(first_arg, has_delta);
}